

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn.c
# Opt level: O0

cmn_type_t cmn_type_from_str(char *str)

{
  int iVar1;
  cmn_type_t local_1c;
  int i;
  char *str_local;
  
  local_1c = CMN_NONE;
  while( true ) {
    if (2 < (int)local_1c) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn.c"
              ,0x50,"Unknown CMN type \'%s\'\n",str);
      exit(1);
    }
    iVar1 = strcmp(str,cmn_type_str[(int)local_1c]);
    if (iVar1 == 0) break;
    iVar1 = strcmp(str,cmn_alt_type_str[(int)local_1c]);
    if (iVar1 == 0) {
      return local_1c;
    }
    local_1c = local_1c + CMN_BATCH;
  }
  return local_1c;
}

Assistant:

cmn_type_t
cmn_type_from_str(const char *str)
{
    int i;

    for (i = 0; i < n_cmn_type_str; ++i) {
        if (0 == strcmp(str, cmn_type_str[i]) || 0 == strcmp(str, cmn_alt_type_str[i]))
            return (cmn_type_t)i;
    }
    E_FATAL("Unknown CMN type '%s'\n", str);
    return CMN_NONE;
}